

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

void uncreate_artifacts(chunk_conflict *c)

{
  loc grid;
  object *poVar1;
  wchar_t y;
  int y_00;
  int x;
  
  for (y_00 = 0; y_00 < c->height; y_00 = y_00 + 1) {
    for (x = 0; x < c->width; x = x + 1) {
      grid = (loc)loc(x,y_00);
      for (poVar1 = square_object(c,grid); poVar1 != (object *)0x0; poVar1 = poVar1->next) {
        if (poVar1->artifact != (artifact *)0x0) {
          mark_artifact_created(poVar1->artifact,false);
        }
      }
    }
  }
  return;
}

Assistant:

void uncreate_artifacts(struct chunk *c)
{
	int y, x;

	/* Also mark created artifacts as not created ... */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(c, grid);
			while (obj) {
				if (obj->artifact) {
					mark_artifact_created(obj->artifact, false);
				}
				obj = obj->next;
			}
		}
	}
}